

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::GenerateHelperToArrayPopFastPath
          (Lowerer *this,Instr *instr,LabelInstr *doneLabel,LabelInstr *bailOutLabelHelper)

{
  bool bVar1;
  Instr *this_00;
  Opnd *pOVar2;
  Instr *retInstr;
  JnHelperMethod helperMethod;
  ValueType arrayValueType;
  Opnd *arrayHelperOpnd;
  LabelInstr *bailOutLabelHelper_local;
  LabelInstr *doneLabel_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  _helperMethod = IR::Instr::UnlinkSrc1(instr);
  retInstr._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(_helperMethod);
  bVar1 = ValueType::IsLikelyNativeArray((ValueType *)((long)&retInstr + 6));
  if ((bVar1) && (pOVar2 = IR::Instr::GetDst(instr), pOVar2 == (Opnd *)0x0)) {
    retInstr._0_4_ = HelperArray_NativePopWithNoDst;
  }
  else {
    bVar1 = ValueType::IsLikelyNativeIntArray((ValueType *)((long)&retInstr + 6));
    if (bVar1) {
      retInstr._0_4_ = HelperArray_NativeIntPop;
    }
    else {
      bVar1 = ValueType::IsLikelyNativeFloatArray((ValueType *)((long)&retInstr + 6));
      if (bVar1) {
        retInstr._0_4_ = HelperArray_NativeFloatPop;
      }
      else {
        retInstr._0_4_ = HelperArray_VarPop;
      }
    }
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,_helperMethod);
  LoadScriptContext(this,instr);
  this_00 = LowererMD::ChangeToHelperCall
                      (&this->m_lowererMD,instr,(JnHelperMethod)retInstr,bailOutLabelHelper,
                       (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  bVar1 = ValueType::IsLikelyNativeArray((ValueType *)((long)&retInstr + 6));
  if (bVar1) {
    pOVar2 = IR::Instr::GetDst(this_00);
    if (pOVar2 == (Opnd *)0x0) {
      InsertBranch(Br,true,doneLabel,&bailOutLabelHelper->super_Instr);
    }
    else {
      pOVar2 = IR::Instr::GetDst(this_00);
      InsertMissingItemCompareBranch(this,pOVar2,BrNeq_A,doneLabel,&bailOutLabelHelper->super_Instr)
      ;
    }
  }
  return this_00;
}

Assistant:

IR::Instr *
Lowerer::GenerateHelperToArrayPopFastPath(IR::Instr * instr, IR::LabelInstr * doneLabel, IR::LabelInstr * bailOutLabelHelper)
{
    IR::Opnd * arrayHelperOpnd = instr->UnlinkSrc1();
    ValueType arrayValueType = arrayHelperOpnd->GetValueType();

    IR::JnHelperMethod helperMethod;

    //Decide the helperMethod based on dst availability and nativity of the array.
    // ToDo: Maybe ignore fast path if `JavascriptArray::HasAnyES5ArrayInPrototypeChain`. See #6582 and #6824.
    if(arrayValueType.IsLikelyNativeArray() && !instr->GetDst())
    {
        helperMethod = IR::HelperArray_NativePopWithNoDst;
    }
    else if(arrayValueType.IsLikelyNativeIntArray())
    {
        helperMethod = IR::HelperArray_NativeIntPop;
    }
    else if(arrayValueType.IsLikelyNativeFloatArray())
    {
        helperMethod = IR::HelperArray_NativeFloatPop;
    }
    else
    {
        helperMethod = IR::HelperArray_VarPop;
    }

    m_lowererMD.LoadHelperArgument(instr, arrayHelperOpnd);

    LoadScriptContext(instr);

    IR::Instr * retInstr = m_lowererMD.ChangeToHelperCall(instr, helperMethod, bailOutLabelHelper);

    //We don't need missing item check for var arrays, as there it is taken care by the helper.
    if(arrayValueType.IsLikelyNativeArray())
    {
        if(retInstr->GetDst())
        {
            //Do this check only for native arrays with Dst. For Var arrays, this is taken care in the Runtime helper itself.
            InsertMissingItemCompareBranch(retInstr->GetDst(), Js::OpCode::BrNeq_A, doneLabel, bailOutLabelHelper);
        }
        else
        {
            //We need unconditional jump to doneLabel, if there is no dst in Pop instr.
            InsertBranch(Js::OpCode::Br, true, doneLabel, bailOutLabelHelper);
        }
    }

    return retInstr;
}